

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase461::run(TestCase461 *this)

{
  Builder reader;
  Reader copyFrom;
  Reader reader_00;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  initializer_list<unsigned_int> list;
  Orphan<capnp::DynamicList> *orphan_00;
  uint local_43c [3];
  iterator local_430;
  undefined8 local_428;
  Builder local_420;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_408;
  Builder local_3e0;
  undefined1 local_3c8 [8];
  Builder root2;
  Reader local_380;
  Type local_340;
  Reader local_330;
  Reader local_300;
  ReaderFor<capnp::DynamicList> local_2e0;
  Orphanage local_2a0;
  undefined1 local_290 [8];
  Orphan<capnp::DynamicList> orphan;
  Builder local_240;
  undefined1 local_228 [8];
  Builder root1;
  undefined1 local_1f0 [8];
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  TestCase461 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&builder2.moreSegments.builder.disposer,0x400,
             GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_1f0,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_228,(MessageBuilder *)&builder2.moreSegments.builder.disposer);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_240,(Builder *)local_228);
  orphan.builder.location._4_4_ = 0xc;
  list._M_len = 3;
  list._M_array = (iterator)((long)&orphan.builder.location + 4);
  AnyPointer::Builder::setAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_240,list);
  local_2a0 = MessageBuilder::getOrphanage((MessageBuilder *)local_1f0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader(&local_330,(Builder *)local_228);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField(&local_300,&local_330);
  local_340 = (Type)Schema::from<capnp::List<unsigned_int,(capnp::Kind)0>>();
  AnyPointer::Reader::getAs<capnp::DynamicList>(&local_2e0,&local_300,(ListSchema)local_340);
  copyFrom.schema.elementType.field_4.schema = local_2e0.schema.elementType.field_4.schema;
  copyFrom.schema.elementType.baseType = local_2e0.schema.elementType.baseType;
  copyFrom.schema.elementType.listDepth = local_2e0.schema.elementType.listDepth;
  copyFrom.schema.elementType.isImplicitParam = local_2e0.schema.elementType.isImplicitParam;
  copyFrom.schema.elementType.field_3 = local_2e0.schema.elementType.field_3;
  copyFrom.schema.elementType._6_2_ = local_2e0.schema.elementType._6_2_;
  copyFrom.reader.segment = local_2e0.reader.segment;
  copyFrom.reader.capTable = local_2e0.reader.capTable;
  copyFrom.reader.ptr = local_2e0.reader.ptr;
  copyFrom.reader.elementCount = local_2e0.reader.elementCount;
  copyFrom.reader.step = local_2e0.reader.step;
  copyFrom.reader.structDataSize = local_2e0.reader.structDataSize;
  copyFrom.reader.structPointerCount = local_2e0.reader.structPointerCount;
  copyFrom.reader.elementSize = local_2e0.reader.elementSize;
  copyFrom.reader._39_1_ = local_2e0.reader._39_1_;
  copyFrom.reader.nestingLimit = local_2e0.reader.nestingLimit;
  copyFrom.reader._44_4_ = local_2e0.reader._44_4_;
  Orphanage::newOrphanCopy<capnp::DynamicList::Reader>
            ((Orphan<capnp::DynamicList> *)local_290,&local_2a0,copyFrom);
  Orphan<capnp::DynamicList>::getReader(&local_380,(Orphan<capnp::DynamicList> *)local_290);
  root2._builder.pointerCount = 0xc;
  root2._builder._38_2_ = 0;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&root2._builder.pointerCount;
  reader_00.schema.elementType.field_4.schema = local_380.schema.elementType.field_4.schema;
  reader_00.schema.elementType.baseType = local_380.schema.elementType.baseType;
  reader_00.schema.elementType.listDepth = local_380.schema.elementType.listDepth;
  reader_00.schema.elementType.isImplicitParam = local_380.schema.elementType.isImplicitParam;
  reader_00.schema.elementType.field_3 = local_380.schema.elementType.field_3;
  reader_00.schema.elementType._6_2_ = local_380.schema.elementType._6_2_;
  reader_00.reader.segment = local_380.reader.segment;
  reader_00.reader.capTable = local_380.reader.capTable;
  reader_00.reader.ptr = local_380.reader.ptr;
  reader_00.reader.elementCount = local_380.reader.elementCount;
  reader_00.reader.step = local_380.reader.step;
  reader_00.reader.structDataSize = local_380.reader.structDataSize;
  reader_00.reader.structPointerCount = local_380.reader.structPointerCount;
  reader_00.reader.elementSize = local_380.reader.elementSize;
  reader_00.reader._39_1_ = local_380.reader._39_1_;
  reader_00.reader.nestingLimit = local_380.reader.nestingLimit;
  reader_00.reader._44_4_ = local_380.reader._44_4_;
  checkList<unsigned_int,capnp::DynamicList::Reader>(reader_00,expected_00);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_3c8,(MessageBuilder *)local_1f0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_3e0,(Builder *)local_3c8);
  orphan_00 = kj::mv<capnp::Orphan<capnp::DynamicList>>((Orphan<capnp::DynamicList> *)local_290);
  AnyPointer::Builder::adopt<capnp::DynamicList>(&local_3e0,orphan_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_420,(Builder *)local_3c8);
  AnyPointer::Builder::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>(&local_408,&local_420);
  local_43c[0] = 0xc;
  local_43c[1] = 0x22;
  local_43c[2] = 0x38;
  local_430 = local_43c;
  local_428 = 3;
  expected._M_len = 3;
  expected._M_array = local_430;
  reader.builder.capTable = local_408.builder.capTable;
  reader.builder.segment = local_408.builder.segment;
  reader.builder.ptr = local_408.builder.ptr;
  reader.builder.elementCount = local_408.builder.elementCount;
  reader.builder.step = local_408.builder.step;
  reader.builder.structDataSize = local_408.builder.structDataSize;
  reader.builder.structPointerCount = local_408.builder.structPointerCount;
  reader.builder.elementSize = local_408.builder.elementSize;
  reader.builder._39_1_ = local_408.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader,expected);
  Orphan<capnp::DynamicList>::~Orphan((Orphan<capnp::DynamicList> *)local_290);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_1f0);
  MallocMessageBuilder::~MallocMessageBuilder
            ((MallocMessageBuilder *)&builder2.moreSegments.builder.disposer);
  return;
}

Assistant:

TEST(Orphans, OrphanageDynamicListCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<test::TestAnyPointer>();
  root1.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});

  Orphan<DynamicList> orphan = builder2.getOrphanage().newOrphanCopy(
      root1.asReader().getAnyPointerField().getAs<DynamicList>(Schema::from<List<uint32_t>>()));
  checkList<uint32_t>(orphan.getReader(), {12, 34, 56});

  auto root2 = builder2.initRoot<test::TestAnyPointer>();
  root2.getAnyPointerField().adopt(kj::mv(orphan));
  checkList(root2.getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});
}